

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O1

void __thiscall
highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>
          (HighwayHashCatT<1U> *this,unsigned_long *hash)

{
  ulong uVar1;
  int lane;
  long lVar2;
  HHStateT<1U> *pHVar3;
  HHStatePortable *pHVar4;
  int iVar5;
  ulong __n;
  uint uVar6;
  char *pcVar8;
  Lanes packet_lanes;
  HHStateT<1U> state_copy;
  uint64_t local_120;
  uint64_t uStack_118;
  ulong local_110;
  undefined8 uStack_108;
  uint64_t local_100;
  uint64_t uStack_f8;
  ulong local_f0;
  uint64_t local_e8;
  HHStatePortable local_d8;
  ulong uVar7;
  
  pHVar3 = &this->state_;
  pHVar4 = &local_d8;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pHVar4->v0[0] = pHVar3->v0[0];
    pHVar3 = (HHStateT<1U> *)(pHVar3->v0 + 1);
    pHVar4 = (HHStatePortable *)(pHVar4->v0 + 1);
  }
  uVar1 = this->buffer_usage_;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      local_d8.v0[lVar2] = local_d8.v0[lVar2] + uVar1 * 0x100000001;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    lVar2 = 8;
    do {
      uVar6 = *(uint *)((long)local_d8.v0 + lVar2 * 4);
      *(uint *)((long)local_d8.v0 + lVar2 * 4) =
           uVar6 >> (0x20 - (byte)uVar1 & 0x1f) | uVar6 << ((byte)uVar1 & 0x1f);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    uVar6 = (uint)uVar1 & 3;
    uVar7 = (ulong)uVar6;
    local_110 = 0;
    uStack_108 = 0;
    local_120 = 0;
    uStack_118 = 0;
    __n = uVar1 & 0xfffffffffffffffc;
    if (__n != 0) {
      memcpy(&local_120,this,__n);
    }
    pcVar8 = this->buffer_ + __n;
    if ((uVar1 & 0x10) == 0) {
      if (uVar7 == 0) {
        local_110 = 0;
      }
      else {
        local_110 = (ulong)CONCAT12(pcVar8[uVar7 - 1],CONCAT11(pcVar8[uVar6 >> 1],*pcVar8));
      }
    }
    else {
      uStack_108 = CONCAT44(*(undefined4 *)(pcVar8 + (uVar7 - 4)),(undefined4)uStack_108);
    }
    local_f0 = local_110;
    local_e8 = uStack_108;
    local_100 = local_120;
    uStack_f8 = uStack_118;
    Portable::HHStatePortable::Update(&local_d8,(Lanes *)&local_100);
  }
  iVar5 = 4;
  do {
    local_100 = local_d8.v0[2] << 0x20 | local_d8.v0[2] >> 0x20;
    uStack_f8 = local_d8.v0[3] << 0x20 | local_d8.v0[3] >> 0x20;
    local_f0 = local_d8.v0[0] << 0x20 | local_d8.v0[0] >> 0x20;
    local_e8 = local_d8.v0[1] << 0x20 | local_d8.v0[1] >> 0x20;
    Portable::HHStatePortable::Update(&local_d8,(Lanes *)&local_100);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  *hash = local_d8.v1[0] + local_d8.v0[0] + local_d8.mul0[0] + local_d8.mul1[0];
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }